

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

void __thiscall
duckdb::ART::ART(ART *this,string *name,IndexConstraintType index_constraint_type,
                vector<unsigned_long,_true> *column_ids,TableIOManager *table_io_manager,
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *unbound_expressions,AttachedDatabase *db,
                shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                *allocators_ptr,IndexStorageInfo *info)

{
  vector<duckdb::PhysicalType,_true> *this_00;
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *this_01;
  value_type vVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  reference pvVar5;
  undefined4 extraout_var;
  InvalidTypeException *this_02;
  reference type;
  ulong __n;
  undefined1 local_d0 [16];
  array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>
  allocator_array;
  unsigned_long prefix_size;
  unsigned_long local_68 [7];
  BlockManager *args_1;
  
  ::std::__cxx11::string::string((string *)&allocator_array,"ART",(allocator *)local_d0);
  BoundIndex::BoundIndex
            (&this->super_BoundIndex,name,(string *)&allocator_array,index_constraint_type,
             column_ids,table_io_manager,unbound_expressions,db);
  ::std::__cxx11::string::~string((string *)&allocator_array);
  (this->super_BoundIndex).super_Index._vptr_Index = (_func_int **)&PTR__ART_027b7f98;
  (this->tree).super_IndexPointer.data = 0;
  this_01 = &this->allocators;
  ::std::
  __shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
                  *)this_01,
                 (__shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
                  *)allocators_ptr);
  this->owns_data = false;
  this->verify_max_key_len = false;
  this_00 = &(this->super_BoundIndex).types;
  for (__n = 0; uVar4 = (long)(this->super_BoundIndex).types.
                              super_vector<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>
                              .
                              super__Vector_base<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_BoundIndex).types.
                              super_vector<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>
                              .
                              super__Vector_base<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start, __n < uVar4; __n = __n + 1)
  {
    pvVar5 = vector<duckdb::PhysicalType,_true>::get<true>(this_00,__n);
    vVar1 = *pvVar5;
    if (((0xc < vVar1) || ((0x1bfeU >> (vVar1 & 0x1f) & 1) == 0)) &&
       ((4 < vVar1 - 200 || ((0x19U >> (vVar1 - 200 & 0x1f) & 1) == 0)))) {
      this_02 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
      type = vector<duckdb::LogicalType,_true>::get<true>
                       (&(this->super_BoundIndex).logical_types,__n);
      ::std::__cxx11::string::string
                ((string *)&allocator_array,"Invalid type for index key.",(allocator *)local_d0);
      InvalidTypeException::InvalidTypeException(this_02,type,(string *)&allocator_array);
      __cxa_throw(this_02,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if (uVar4 < 2) {
    pvVar5 = vector<duckdb::PhysicalType,_true>::get<true>(this_00,0);
    if (*pvVar5 != VARCHAR) goto LAB_019386cf;
  }
  this->verify_max_key_len = true;
LAB_019386cf:
  SetPrefixCount(this,info);
  if ((this_01->internal).
      super___shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    this->owns_data = true;
    prefix_size = (ulong)this->prefix_count + 9;
    iVar3 = (*table_io_manager->_vptr_TableIOManager[2])();
    args_1 = (BlockManager *)CONCAT44(extraout_var,iVar3);
    make_unsafe_uniq<duckdb::FixedSizeAllocator,unsigned_long&,duckdb::BlockManager&>
              ((duckdb *)&allocator_array,&prefix_size,args_1);
    local_d0._0_8_ =
         (tuple<duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>)0x30
    ;
    make_unsafe_uniq<duckdb::FixedSizeAllocator,unsigned_long,duckdb::BlockManager&>
              ((duckdb *)(allocator_array._M_elems + 1),(unsigned_long *)local_d0,args_1);
    local_68[6] = 0x28;
    make_unsafe_uniq<duckdb::FixedSizeAllocator,unsigned_long,duckdb::BlockManager&>
              ((duckdb *)(allocator_array._M_elems + 2),local_68 + 6,args_1);
    local_68[5] = 0x98;
    make_unsafe_uniq<duckdb::FixedSizeAllocator,unsigned_long,duckdb::BlockManager&>
              ((duckdb *)(allocator_array._M_elems + 3),local_68 + 5,args_1);
    local_68[4] = 0x288;
    make_unsafe_uniq<duckdb::FixedSizeAllocator,unsigned_long,duckdb::BlockManager&>
              ((duckdb *)(allocator_array._M_elems + 4),local_68 + 4,args_1);
    local_68[3] = 0x808;
    make_unsafe_uniq<duckdb::FixedSizeAllocator,unsigned_long,duckdb::BlockManager&>
              ((duckdb *)(allocator_array._M_elems + 5),local_68 + 3,args_1);
    local_68[2] = 8;
    make_unsafe_uniq<duckdb::FixedSizeAllocator,unsigned_long,duckdb::BlockManager&>
              ((duckdb *)(allocator_array._M_elems + 6),local_68 + 2,args_1);
    local_68[1] = 0x10;
    make_unsafe_uniq<duckdb::FixedSizeAllocator,unsigned_long,duckdb::BlockManager&>
              ((duckdb *)(allocator_array._M_elems + 7),local_68 + 1,args_1);
    local_68[0] = 0x108;
    make_unsafe_uniq<duckdb::FixedSizeAllocator,unsigned_long,duckdb::BlockManager&>
              ((duckdb *)(allocator_array._M_elems + 8),local_68,args_1);
    make_shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,std::default_delete<duckdb::FixedSizeAllocator>,false>,9ul>,std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,std::default_delete<duckdb::FixedSizeAllocator>,false>,9ul>>
              ((array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>
                *)local_d0);
    shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
    ::operator=(this_01,(shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                         *)local_d0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
    ::std::
    array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>
    ::~array(&allocator_array);
  }
  lVar2 = (info->root_block_ptr).block_id;
  if ((lVar2 != -1) ||
     ((info->allocator_infos).
      super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
      super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (info->allocator_infos).
      super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
      super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    if (lVar2 == -1) {
      (this->tree).super_IndexPointer.data = info->root;
      InitAllocators(this,info);
    }
    else {
      Deserialize(this,&info->root_block_ptr);
    }
  }
  return;
}

Assistant:

ART::ART(const string &name, const IndexConstraintType index_constraint_type, const vector<column_t> &column_ids,
         TableIOManager &table_io_manager, const vector<unique_ptr<Expression>> &unbound_expressions,
         AttachedDatabase &db,
         const shared_ptr<array<unsafe_unique_ptr<FixedSizeAllocator>, ALLOCATOR_COUNT>> &allocators_ptr,
         const IndexStorageInfo &info)
    : BoundIndex(name, ART::TYPE_NAME, index_constraint_type, column_ids, table_io_manager, unbound_expressions, db),
      allocators(allocators_ptr), owns_data(false), verify_max_key_len(false) {

	// FIXME: Use the new byte representation function to support nested types.
	for (idx_t i = 0; i < types.size(); i++) {
		switch (types[i]) {
		case PhysicalType::BOOL:
		case PhysicalType::INT8:
		case PhysicalType::INT16:
		case PhysicalType::INT32:
		case PhysicalType::INT64:
		case PhysicalType::INT128:
		case PhysicalType::UINT8:
		case PhysicalType::UINT16:
		case PhysicalType::UINT32:
		case PhysicalType::UINT64:
		case PhysicalType::UINT128:
		case PhysicalType::FLOAT:
		case PhysicalType::DOUBLE:
		case PhysicalType::VARCHAR:
			break;
		default:
			throw InvalidTypeException(logical_types[i], "Invalid type for index key.");
		}
	}

	if (types.size() > 1) {
		verify_max_key_len = true;
	} else if (types[0] == PhysicalType::VARCHAR) {
		verify_max_key_len = true;
	}

	// Initialize the allocators.
	SetPrefixCount(info);
	if (!allocators) {
		owns_data = true;
		auto prefix_size = NumericCast<idx_t>(prefix_count) + NumericCast<idx_t>(Prefix::METADATA_SIZE);
		auto &block_manager = table_io_manager.GetIndexBlockManager();

		array<unsafe_unique_ptr<FixedSizeAllocator>, ALLOCATOR_COUNT> allocator_array = {
		    make_unsafe_uniq<FixedSizeAllocator>(prefix_size, block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Leaf), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node4), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node16), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node48), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node256), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node7Leaf), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node15Leaf), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node256Leaf), block_manager),
		};
		allocators =
		    make_shared_ptr<array<unsafe_unique_ptr<FixedSizeAllocator>, ALLOCATOR_COUNT>>(std::move(allocator_array));
	}

	if (!info.IsValid()) {
		// We create a new ART.
		return;
	}

	if (info.root_block_ptr.IsValid()) {
		// Backwards compatibility.
		Deserialize(info.root_block_ptr);
		return;
	}

	// Set the root node and initialize the allocators.
	tree.Set(info.root);
	InitAllocators(info);
}